

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# budCovEntries.cpp
# Opt level: O3

cl_command_queue
clCreateCommandQueue
          (cl_context context,cl_device_id device,cl_command_queue_properties properties,
          cl_int *errcode_ret)

{
  int iVar1;
  
  iVar1 = -0x22;
  if (context[8] == (_cl_context)0x4) {
    iVar1 = (uint)(device[8] == (_cl_device_id)0x2) * 3 + -0x21;
  }
  *errcode_ret = iVar1;
  return (cl_command_queue)0x0;
}

Assistant:

CL_API_ENTRY CL_EXT_PREFIX__VERSION_1_2_DEPRECATED cl_command_queue CL_API_CALL
clCreateCommandQueue(cl_context context,
                     cl_device_id device,
                     cl_command_queue_properties properties,
                     cl_int* errcode_ret) CL_EXT_SUFFIX__VERSION_1_2_DEPRECATED
{
    if (!cov::isValidObject<cov::Context>(context)) {
        *errcode_ret = CL_INVALID_CONTEXT;
        return nullptr;
    }
    if (!cov::isValidObject<cov::Device>(device)) {
        *errcode_ret = CL_INVALID_DEVICE;
        return nullptr;
    }
    if (properties != CL_QUEUE_OUT_OF_ORDER_EXEC_MODE_ENABLE || properties != CL_QUEUE_PROFILING_ENABLE) {
        *errcode_ret = CL_INVALID_VALUE;
        return nullptr;
    }

    return cov::createCommandQueue(context, device, properties, errcode_ret);
}